

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall LogImpl::LogImpl(LogImpl *this)

{
  int iVar1;
  ConfigSet config;
  string local_70;
  ConfigSet local_50;
  StringConverter local_40;
  
  (this->m_config).mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::ofstream::ofstream(&this->m_ofstream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_prefix,s_prefix,(allocator<char> *)&local_70);
  cali::RuntimeConfig::get_default_config();
  cali::RuntimeConfig::init((RuntimeConfig *)&local_50,(EVP_PKEY_CTX *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
  cali::ConfigSet::get((StringConverter *)&local_70,&local_50,"verbosity");
  iVar1 = cali::StringConverter::to_int((StringConverter *)&local_70,(bool *)0x0);
  this->m_verbosity = iVar1;
  std::__cxx11::string::~string((string *)&local_70);
  cali::ConfigSet::get(&local_40,&local_50,"logfile");
  std::__cxx11::string::string((string *)&local_70,(string *)&local_40);
  init_stream(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

LogImpl() : m_prefix { s_prefix }
    {
        ConfigSet config = RuntimeConfig::get_default_config().init("log", s_configdata);

        m_verbosity = config.get("verbosity").to_int();
        init_stream(config.get("logfile").to_string());
    }